

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha256.c
# Opt level: O3

void sha256_transform(SHA256_CTX *ctx,BYTE *data)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [13];
  undefined1 auVar10 [13];
  undefined1 auVar11 [13];
  undefined1 auVar12 [13];
  undefined1 auVar13 [13];
  undefined1 auVar14 [13];
  undefined1 auVar15 [15];
  undefined1 auVar16 [15];
  undefined1 auVar17 [15];
  undefined1 auVar18 [13];
  undefined1 auVar19 [13];
  undefined1 auVar20 [16];
  uint uVar21;
  long lVar22;
  uint uVar23;
  uint uVar24;
  uint uVar25;
  uint uVar26;
  int iVar27;
  uint uVar28;
  uint uVar29;
  uint uVar30;
  uint uVar31;
  uint uVar32;
  undefined1 auVar33 [16];
  uint uVar34;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  int aiStack_174 [8];
  int local_154 [7];
  int local_138 [66];
  
  lVar22 = 0;
  do {
    auVar20._1_4_ = (uint)data[lVar22 * 4 + 4] << 0x18;
    auVar20[0] = data[lVar22 * 4];
    auVar20._5_4_ = (uint)data[lVar22 * 4 + 8] << 0x18;
    auVar20._9_4_ = (uint)data[lVar22 * 4 + 0xc] << 0x18;
    auVar20._13_3_ = 0;
    auVar8[1] = 0;
    auVar8[0] = data[lVar22 * 4 + 5];
    auVar15._12_2_ = 0;
    auVar15._0_12_ = SUB1612((undefined1  [16])0x0,0);
    auVar15[0xe] = data[lVar22 * 4 + 0xd];
    auVar16[10] = data[lVar22 * 4 + 9];
    auVar16._0_10_ = SUB1610((undefined1  [16])0x0,0);
    auVar16[0xb] = 0;
    auVar16._12_3_ = auVar15._12_3_;
    auVar17._10_5_ = auVar16._10_5_;
    auVar17._0_10_ = (unkuint10)0;
    auVar8._2_7_ = auVar17._8_7_;
    auVar8._9_7_ = 0;
    auVar33._4_12_ = SUB1612(auVar8 << 0x30,4);
    auVar33._0_4_ = (CONCAT11(data[lVar22 * 4 + 5],data[lVar22 * 4 + 1]) & 0xff) << 0x10;
    auVar9[0xc] = data[lVar22 * 4 + 0xe];
    auVar9._0_12_ = ZEXT812(0);
    auVar10._10_3_ = auVar9._10_3_;
    auVar10._0_10_ = (unkuint10)data[lVar22 * 4 + 10] << 0x40;
    auVar18._5_8_ = 0;
    auVar18._0_5_ = auVar10._8_5_;
    uVar34 = CONCAT13(0,CONCAT12(data[lVar22 * 4 + 6],(ushort)data[lVar22 * 4 + 2]));
    auVar11[4] = data[lVar22 * 4 + 6];
    auVar11._0_4_ = uVar34;
    auVar11[5] = 0;
    auVar11._6_7_ = SUB137(auVar18 << 0x40,6);
    auVar35._0_4_ = (uVar34 & 0xffff) << 8;
    auVar35._4_4_ = auVar11._4_4_ << 8;
    auVar35._8_4_ = auVar10._8_4_ << 8;
    auVar35._12_4_ = (uint)(uint3)(auVar9._10_3_ >> 0x10) << 8;
    auVar12[0xc] = data[lVar22 * 4 + 0xf];
    auVar12._0_12_ = ZEXT812(0);
    auVar13._10_3_ = auVar12._10_3_;
    auVar13._0_10_ = (unkuint10)data[lVar22 * 4 + 0xb] << 0x40;
    auVar19._5_8_ = 0;
    auVar19._0_5_ = auVar13._8_5_;
    uVar34 = CONCAT13(0,CONCAT12(data[lVar22 * 4 + 7],(ushort)data[lVar22 * 4 + 3]));
    auVar14[4] = data[lVar22 * 4 + 7];
    auVar14._0_4_ = uVar34;
    auVar14[5] = 0;
    auVar14._6_7_ = SUB137(auVar19 << 0x40,6);
    auVar36._0_4_ = uVar34 & 0xffff;
    auVar36._4_9_ = auVar14._4_9_;
    auVar36._13_3_ = 0;
    *(undefined1 (*) [16])(local_138 + lVar22) = auVar36 | auVar35 | auVar33 | auVar20 << 0x18;
    lVar22 = lVar22 + 4;
  } while (lVar22 != 0x10);
  lVar22 = 0x10;
  do {
    iVar27 = aiStack_174[lVar22];
    iVar1 = local_138[lVar22 + -2];
    local_138[lVar22] =
         local_138[0] + local_154[lVar22] +
         (iVar1 >> 10 ^ (iVar1 << 0xd | iVar1 >> 0x13) ^ (iVar1 << 0xf | iVar1 >> 0x11)) +
         (iVar27 >> 3 ^ (iVar27 << 0xe | iVar27 >> 0x12) ^ (iVar27 << 0x19 | iVar27 >> 7));
    lVar22 = lVar22 + 1;
    local_138[0] = iVar27;
  } while (lVar22 != 0x40);
  uVar34 = ctx->state[1];
  uVar2 = ctx->state[2];
  uVar3 = ctx->state[3];
  uVar4 = ctx->state[4];
  uVar5 = ctx->state[5];
  uVar6 = ctx->state[6];
  uVar7 = ctx->state[7];
  lVar22 = 0;
  uVar31 = ctx->state[0];
  uVar30 = uVar34;
  uVar21 = uVar2;
  uVar29 = uVar3;
  uVar24 = uVar4;
  uVar23 = uVar5;
  uVar32 = uVar6;
  uVar25 = uVar7;
  do {
    uVar26 = uVar32;
    uVar32 = uVar23;
    uVar23 = uVar24;
    uVar28 = uVar21;
    uVar21 = uVar30;
    uVar30 = uVar31;
    iVar27 = ((uVar32 ^ uVar26) & uVar23 ^ uVar26) + uVar25 +
             ((uVar23 << 7 | (int)uVar23 >> 0x19) ^
             (uVar23 << 0x15 | (int)uVar23 >> 0xb) ^ (uVar23 << 0x1a | (int)uVar23 >> 6)) +
             *(int *)((long)k + lVar22) + *(int *)((long)local_138 + lVar22);
    uVar24 = uVar29 + iVar27;
    uVar31 = (uVar21 & uVar28 ^ (uVar21 ^ uVar28) & uVar30) +
             ((uVar30 << 10 | (int)uVar30 >> 0x16) ^
             (uVar30 << 0x13 | (int)uVar30 >> 0xd) ^ (uVar30 << 0x1e | (int)uVar30 >> 2)) + iVar27;
    lVar22 = lVar22 + 4;
    uVar29 = uVar28;
    uVar25 = uVar26;
  } while (lVar22 != 0x100);
  ctx->state[0] = uVar31 + ctx->state[0];
  ctx->state[1] = uVar30 + uVar34;
  ctx->state[2] = uVar21 + uVar2;
  ctx->state[3] = uVar28 + uVar3;
  ctx->state[4] = uVar24 + uVar4;
  ctx->state[5] = uVar23 + uVar5;
  ctx->state[6] = uVar32 + uVar6;
  ctx->state[7] = uVar26 + uVar7;
  return;
}

Assistant:

static inline void sha256_transform(SHA256_CTX *ctx, const BYTE data[])
{
    WORD a, b, c, d, e, f, g, h, i, j, t1, t2, m[64];

    for (i = 0, j = 0; i < 16; ++i, j += 4)
        m[i] = (data[j] << 24) | (data[j + 1] << 16) | (data[j + 2] << 8) | (data[j + 3]);
    for ( ; i < 64; ++i)
        m[i] = SIG1(m[i - 2]) + m[i - 7] + SIG0(m[i - 15]) + m[i - 16];

    a = ctx->state[0];
    b = ctx->state[1];
    c = ctx->state[2];
    d = ctx->state[3];
    e = ctx->state[4];
    f = ctx->state[5];
    g = ctx->state[6];
    h = ctx->state[7];

    for (i = 0; i < 64; ++i) {
        t1 = h + EP1(e) + CH(e,f,g) + k[i] + m[i];
        t2 = EP0(a) + MAJ(a,b,c);
        h = g;
        g = f;
        f = e;
        e = d + t1;
        d = c;
        c = b;
        b = a;
        a = t1 + t2;
    }

    ctx->state[0] += a;
    ctx->state[1] += b;
    ctx->state[2] += c;
    ctx->state[3] += d;
    ctx->state[4] += e;
    ctx->state[5] += f;
    ctx->state[6] += g;
    ctx->state[7] += h;
}